

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O2

void __thiscall
duckdb::SQLLogicTestRunner::LoadDatabase
          (SQLLogicTestRunner *this,string *dbpath,bool load_extensions)

{
  unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *this_00;
  pointer __p;
  type pDVar1;
  __node_base *p_Var2;
  AssertionHandler catchAssertionHandler;
  ErrorData err;
  
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->loaded_databases,(value_type *)dbpath);
  this_00 = &this->db;
  std::__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>::reset
            ((__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_> *)this_00,
             (pointer)0x0);
  std::__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_>::reset
            ((__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_> *)
             &this->con,(pointer)0x0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->named_connection_map)._M_h);
  catchAssertionHandler.m_assertionInfo.macroName.m_start =
       (char *)(this->config).
               super_unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>._M_t.
               super___uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>.
               super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl;
  make_uniq<duckdb::DuckDB,std::__cxx11::string&,duckdb::DBConfig*>
            ((duckdb *)&err,dbpath,(DBConfig **)&catchAssertionHandler);
  __p = _err;
  _err = (pointer)0x0;
  std::__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>::reset
            ((__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_> *)this_00,__p);
  std::unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>::~unique_ptr
            ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_> *)&err);
  pDVar1 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*(this_00)
  ;
  std::__cxx11::string::string((string *)&err,"core_functions",(allocator *)&catchAssertionHandler);
  duckdb::ExtensionHelper::LoadExtension(pDVar1,(string *)&err);
  std::__cxx11::string::~string((string *)&err);
  Reconnect(this);
  if (load_extensions) {
    p_Var2 = &(this->extensions)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      pDVar1 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*
                         (this_00);
      duckdb::ExtensionHelper::LoadExtension(pDVar1,(string *)(p_Var2 + 1));
    }
  }
  return;
}

Assistant:

void SQLLogicTestRunner::LoadDatabase(string dbpath, bool load_extensions) {
	loaded_databases.push_back(dbpath);

	// restart the database with the specified db path
	db.reset();
	con.reset();
	named_connection_map.clear();
	// now re-open the current database

	try {
		db = make_uniq<DuckDB>(dbpath, config.get());
		// always load core functions
		ExtensionHelper::LoadExtension(*db, "core_functions");
	} catch (std::exception &ex) {
		ErrorData err(ex);
		SQLLogicTestLogger::LoadDatabaseFail(dbpath, err.Message());
		FAIL();
	}
	Reconnect();

	// load any previously loaded extensions again
	if (load_extensions) {
		for (auto &extension : extensions) {
			ExtensionHelper::LoadExtension(*db, extension);
		}
	}
}